

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NodesStamp.hpp
# Opt level: O0

void __thiscall OpenMD::NodesStamp::~NodesStamp(NodesStamp *this)

{
  DataHolder *in_RDI;
  vector<int,_std::allocator<int>_> *unaff_retaddr;
  
  in_RDI->_vptr_DataHolder = (_func_int **)&PTR__NodesStamp_005094d0;
  std::vector<int,_std::allocator<int>_>::~vector(unaff_retaddr);
  DataHolder::~DataHolder(in_RDI);
  return;
}

Assistant:

NodesStamp() {}